

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_mel_cepstral_analysis.h
# Opt level: O0

void __thiscall sptk::SecondOrderAllPassMelCepstralAnalysis::Buffer::Buffer(Buffer *this)

{
  undefined8 *in_RDI;
  Buffer *in_stack_00000020;
  Buffer *in_stack_ffffffffffffff80;
  
  *in_RDI = &PTR__Buffer_0013d630;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c04);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c17);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c2a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x107c3d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c63);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c79);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107c8f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107ca5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107cbb);
  RealValuedFastFourierTransform::Buffer::Buffer(in_stack_ffffffffffffff80);
  RealValuedInverseFastFourierTransform::Buffer::Buffer((Buffer *)0x107ce9);
  ToeplitzPlusHankelSystemSolver::Buffer::Buffer(in_stack_00000020);
  return;
}

Assistant:

Buffer() {
    }